

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1dec.c
# Opt level: O2

int jpc_dec_decodecblks(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  jpc_fix_t *pjVar1;
  jpc_dec_seg_t **ppjVar2;
  byte *pbVar3;
  byte bVar4;
  _Bool _Var5;
  jpc_dec_tcomp_t *pjVar6;
  jpc_dec_seg_t *seg;
  jas_matrix_t *pjVar7;
  jpc_mqstate_t *pjVar8;
  uint uVar9;
  jas_matind_t jVar10;
  jas_matind_t jVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  jas_matrix_t *pjVar16;
  jpc_dec_seglist_t *pjVar17;
  jpc_mqdec_t *pjVar18;
  jpc_bitstream_t *pjVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  uint_fast32_t uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  jas_seqent_t *pjVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  jas_seqent_t *pjVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  jas_seqent_t *pjVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  jas_seqent_t *pjVar48;
  int iVar49;
  int i;
  uint uVar50;
  jpc_dec_cblk_t *pjVar51;
  ulong *puVar52;
  jpc_dec_band_t *pjVar53;
  ulong uVar54;
  bool bVar55;
  jas_seqent_t *local_160;
  int poshalf;
  jas_seqent_t *local_150;
  int neghalf;
  int width;
  jas_seqent_t *local_138;
  jas_seqent_t *local_130;
  jas_seqent_t *local_128;
  jas_seqent_t *local_120;
  jas_seqent_t *local_118;
  jas_seqent_t *local_110;
  jas_seqent_t *local_108;
  jas_seqent_t *local_e0;
  jpc_dec_rlvl_t *local_b8;
  jpc_dec_tcomp_t *local_a0;
  jpc_dec_prc_t *local_98;
  jas_seqent_t *local_60;
  jas_seqent_t *local_58;
  
  iVar15 = dec->numcomps;
  local_a0 = tile->tcomps;
  do {
    if (iVar15 < 1) {
      return 0;
    }
    local_b8 = local_a0->rlvls;
    for (uVar29 = local_a0->numrlvls; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
      pjVar53 = local_b8->bands;
      if (pjVar53 != (jpc_dec_band_t *)0x0) {
        for (iVar25 = local_b8->numbands; 0 < iVar25; iVar25 = iVar25 + -1) {
          if (pjVar53->data != (jas_matrix_t *)0x0) {
            local_98 = pjVar53->prcs;
            for (iVar40 = local_b8->numprcs; 0 < iVar40; iVar40 = iVar40 + -1) {
              pjVar51 = local_98->cblks;
              if (pjVar51 != (jpc_dec_cblk_t *)0x0) {
                for (iVar38 = local_98->numcblks; 0 < iVar38; iVar38 = iVar38 + -1) {
                  pjVar6 = tile->tcomps;
                  if (pjVar51->flags == (jas_matrix_t *)0x0) {
                    pjVar16 = jas_matrix_create(pjVar51->data->numrows_ + 2,
                                                pjVar51->data->numcols_ + 2);
                    pjVar51->flags = pjVar16;
                    if (pjVar16 == (jas_matrix_t *)0x0) {
                      return -1;
                    }
                  }
                  ppjVar2 = &pjVar51->curseg;
                  iVar31 = (int)((ulong)((long)local_a0 - (long)pjVar6) >> 6);
                  pjVar17 = &pjVar51->segs;
                  while ((seg = pjVar17->head, seg != (jpc_dec_seg_t *)0x0 && (seg->lyrno < 0x4000))
                        ) {
                    if (seg->stream == (jas_stream_t *)0x0) {
                      __assert_fail("seg->stream",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                    ,0xd7,
                                    "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                   );
                    }
                    jas_stream_rewind(seg->stream);
                    jas_stream_setrwcount(seg->stream,0);
                    if (seg->type == 2) {
                      if (pjVar51->nulldec == (jpc_bitstream_t *)0x0) {
                        pjVar19 = jpc_bitstream_sopen(seg->stream,"r");
                        pjVar51->nulldec = pjVar19;
                        if (pjVar19 == (jpc_bitstream_t *)0x0) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                        ,0xe7,
                                        "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                       );
                        }
                      }
                    }
                    else {
                      if (seg->type != 1) {
                        __assert_fail("seg->type == JPC_SEG_RAW",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                      ,0xe4,
                                      "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                     );
                      }
                      pjVar18 = pjVar51->mqdec;
                      if (pjVar18 == (jpc_mqdec_t *)0x0) {
                        pjVar18 = jpc_mqdec_create(0x13,(jas_stream_t *)0x0);
                        pjVar51->mqdec = pjVar18;
                        if (pjVar18 == (jpc_mqdec_t *)0x0) {
                          return -1;
                        }
                        jpc_mqdec_setctxs(pjVar18,0x13,jpc_mqctxs);
                        pjVar18 = pjVar51->mqdec;
                      }
                      jpc_mqdec_setinput(pjVar18,seg->stream);
                      jpc_mqdec_init(pjVar51->mqdec);
                    }
                    iVar32 = 0;
LAB_00126643:
                    if (iVar32 < seg->numpasses) {
                      iVar36 = pjVar51->numimsbs;
                      iVar28 = pjVar53->numbps;
                      if ((iVar28 < iVar36) &&
                         ((bVar23 = tile->cp->ccps[iVar31].roishift, bVar23 == 0 ||
                          (iVar36 < (int)((uint)bVar23 - iVar28))))) {
                        jas_eprintf("warning: corrupt code stream\n");
                        iVar28 = pjVar53->numbps;
                        iVar36 = pjVar51->numimsbs;
                      }
                      iVar24 = seg->passno + iVar32;
                      uVar35 = ~(((iVar24 - pjVar51->firstpassno) + 2) / 3 + iVar36) +
                               iVar28 + pjVar53->roishift;
                      if (-1 < (int)uVar35) {
                        uVar27 = (iVar24 + 2) % 3;
                        if (0x1e < uVar35) {
                          __assert_fail("bpno >= 0 && bpno < 31",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                        ,0x102,
                                        "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                       );
                        }
                        bVar23 = (byte)uVar35;
                        if (uVar27 == 2) {
                          if (seg->type != 1) {
                            __assert_fail("seg->type == JPC_SEG_MQ",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                          ,0x117,
                                          "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                         );
                          }
                          pjVar18 = pjVar51->mqdec;
                          pjVar16 = pjVar51->flags;
                          iVar36 = pjVar53->orient;
                          bVar4 = tile->cp->ccps[iVar31].cblkctx;
                          pjVar7 = pjVar51->data;
                          uVar50 = (uint)(1 << (bVar23 & 0x1f)) >> 1 | 1 << (uVar35 & 0x1f);
                          iVar28 = (int)pjVar7->numrows_;
                          jVar10 = pjVar7->numcols_;
                          sVar20 = jas_matrix_rowstep(pjVar16);
                          sVar21 = jas_matrix_rowstep(pjVar7);
                          uVar35 = (uint)sVar20;
                          iVar41 = uVar35 * 4;
                          iVar24 = (int)sVar21;
                          local_e0 = pjVar16->rows_[1];
                          pjVar30 = local_e0 + 1;
                          local_138 = *pjVar7->rows_;
                          lVar42 = (long)(int)uVar35;
                          uVar43 = iVar36 << 8;
                          uVar46 = -uVar50;
                          local_60 = local_e0 + lVar42 * 3 + 1;
                          local_58 = local_e0 + lVar42 * 2 + 1;
                          local_e0 = local_e0 + lVar42 + 1;
                          for (iVar36 = 0; iVar45 = iVar28 - iVar36, iVar45 != 0 && iVar36 <= iVar28
                              ; iVar36 = iVar36 + 4) {
                            iVar14 = 4;
                            if (iVar45 < 4) {
                              iVar14 = iVar45;
                            }
                            lVar47 = 0;
                            pjVar48 = pjVar30;
                            pjVar39 = local_138;
                            for (iVar37 = (int)jVar10; 0 < iVar37; iVar37 = iVar37 + -1) {
                              puVar52 = (ulong *)((long)pjVar30 + lVar47);
                              uVar54 = *puVar52;
                              if ((((iVar45 < 4) || ((uVar54 & 0x50ff) != 0)) ||
                                  ((*(ushort *)((long)local_e0 + lVar47) & 0x50ff) != 0)) ||
                                 (((*(ushort *)((long)local_58 + lVar47) & 0x50ff) != 0 ||
                                  ((*(ushort *)((long)local_60 + lVar47) & 0x50ff) != 0)))) {
                                pjVar34 = (jas_seqent_t *)((long)local_138 + lVar47);
                                iVar49 = iVar14;
LAB_00127417:
                                if ((uVar54 & 0x5000) == 0) {
                                  bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar43];
                                  pjVar18->curctx = pjVar18->ctxs + bVar23;
                                  pjVar8 = pjVar18->ctxs[bVar23];
                                  uVar33 = pjVar8->qeval;
                                  uVar26 = pjVar18->areg - uVar33;
                                  pjVar18->areg = uVar26;
                                  if (pjVar18->creg >> 0x10 < uVar33) {
                                    uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                  }
                                  else {
                                    pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                    if ((short)uVar26 < 0) {
                                      uVar44 = (uint)pjVar8->mps;
                                    }
                                    else {
                                      uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                    }
                                  }
                                  if (uVar44 == 0) {
                                    uVar54 = *puVar52;
                                  }
                                  else {
switchD_00127cfd_caseD_0:
                                    uVar33 = uVar54 >> 4 & 0xff;
                                    bVar23 = jpc_scctxnolut[uVar33];
                                    pjVar18->curctx = pjVar18->ctxs + bVar23;
                                    pjVar8 = pjVar18->ctxs[bVar23];
                                    uVar54 = pjVar8->qeval;
                                    uVar26 = pjVar18->areg - uVar54;
                                    pjVar18->areg = uVar26;
                                    if (pjVar18->creg >> 0x10 < uVar54) {
                                      uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                    }
                                    else {
                                      pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                      if ((short)uVar26 < 0) {
                                        uVar44 = (uint)pjVar8->mps;
                                      }
                                      else {
                                        uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                      }
                                    }
                                    _Var5 = jpc_spblut[uVar33];
                                    uVar12 = uVar50;
                                    if (uVar44 != _Var5) {
                                      uVar12 = uVar46;
                                    }
                                    *pjVar34 = (long)(int)uVar12;
                                    JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar35,uVar44 != _Var5,
                                                     SUB41((bVar4 & 8) >> 3,0));
                                    uVar54 = *puVar52 | 0x1000;
                                    *puVar52 = uVar54;
                                  }
                                }
                                *puVar52 = uVar54 & 0xffffffffffffbfff;
                                if (1 < iVar49) {
                                  iVar49 = iVar49 + -1;
                                  puVar52 = puVar52 + lVar42;
                                  pjVar34 = pjVar34 + iVar24;
                                  uVar54 = *puVar52;
                                  if ((uVar54 & 0x5000) == 0) {
                                    bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar43];
                                    pjVar18->curctx = pjVar18->ctxs + bVar23;
                                    pjVar8 = pjVar18->ctxs[bVar23];
                                    uVar33 = pjVar8->qeval;
                                    uVar26 = pjVar18->areg - uVar33;
                                    pjVar18->areg = uVar26;
                                    if (pjVar18->creg >> 0x10 < uVar33) {
                                      uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                    }
                                    else {
                                      pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                      if ((short)uVar26 < 0) {
                                        uVar44 = (uint)pjVar8->mps;
                                      }
                                      else {
                                        uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                      }
                                    }
                                    if (uVar44 == 0) {
                                      uVar54 = *puVar52;
                                    }
                                    else {
switchD_00127cfd_caseD_1:
                                      uVar33 = uVar54 >> 4 & 0xff;
                                      bVar23 = jpc_scctxnolut[uVar33];
                                      pjVar18->curctx = pjVar18->ctxs + bVar23;
                                      pjVar8 = pjVar18->ctxs[bVar23];
                                      uVar54 = pjVar8->qeval;
                                      uVar26 = pjVar18->areg - uVar54;
                                      pjVar18->areg = uVar26;
                                      if (pjVar18->creg >> 0x10 < uVar54) {
                                        uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                      }
                                      else {
                                        pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                        if ((short)uVar26 < 0) {
                                          uVar44 = (uint)pjVar8->mps;
                                        }
                                        else {
                                          uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                        }
                                      }
                                      _Var5 = jpc_spblut[uVar33];
                                      uVar12 = uVar50;
                                      if (uVar44 != _Var5) {
                                        uVar12 = uVar46;
                                      }
                                      *pjVar34 = (long)(int)uVar12;
                                      JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar35,uVar44 != _Var5,
                                                       false);
                                      uVar54 = *puVar52 | 0x1000;
                                      *puVar52 = uVar54;
                                    }
                                  }
                                  *puVar52 = uVar54 & 0xffffffffffffbfff;
                                  if (1 < iVar49) {
                                    iVar49 = iVar49 + -1;
                                    puVar52 = puVar52 + lVar42;
                                    pjVar34 = pjVar34 + iVar24;
                                    uVar54 = *puVar52;
                                    if ((uVar54 & 0x5000) == 0) {
                                      bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar43];
                                      pjVar18->curctx = pjVar18->ctxs + bVar23;
                                      pjVar8 = pjVar18->ctxs[bVar23];
                                      uVar33 = pjVar8->qeval;
                                      uVar26 = pjVar18->areg - uVar33;
                                      pjVar18->areg = uVar26;
                                      if (pjVar18->creg >> 0x10 < uVar33) {
                                        uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                      }
                                      else {
                                        pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                        if ((short)uVar26 < 0) {
                                          uVar44 = (uint)pjVar8->mps;
                                        }
                                        else {
                                          uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                        }
                                      }
                                      if (uVar44 != 0) goto switchD_00127cfd_caseD_2;
                                      uVar54 = *puVar52;
                                    }
LAB_001279e3:
                                    *puVar52 = uVar54 & 0xffffffffffffbfff;
                                    if (1 < iVar49) {
                                      puVar52 = puVar52 + lVar42;
                                      uVar54 = *puVar52;
                                      if ((uVar54 & 0x5000) == 0) {
                                        bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar43];
                                        pjVar18->curctx = pjVar18->ctxs + bVar23;
                                        pjVar8 = pjVar18->ctxs[bVar23];
                                        uVar33 = pjVar8->qeval;
                                        uVar26 = pjVar18->areg - uVar33;
                                        pjVar18->areg = uVar26;
                                        if (pjVar18->creg >> 0x10 < uVar33) {
                                          uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                        }
                                        else {
                                          pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                          if ((short)uVar26 < 0) {
                                            uVar44 = (uint)pjVar8->mps;
                                          }
                                          else {
                                            uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                          }
                                        }
                                        if (uVar44 != 0) {
                                          pjVar34 = pjVar34 + iVar24;
                                          goto switchD_00127cfd_caseD_3;
                                        }
                                        uVar54 = *puVar52;
                                      }
                                      goto LAB_00127bc0;
                                    }
                                  }
                                }
                              }
                              else {
                                pjVar18->curctx = pjVar18->ctxs;
                                pjVar8 = *pjVar18->ctxs;
                                uVar54 = pjVar8->qeval;
                                uVar26 = pjVar18->areg - uVar54;
                                pjVar18->areg = uVar26;
                                if (pjVar18->creg >> 0x10 < uVar54) {
                                  uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                }
                                else {
                                  pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                  if ((short)uVar26 < 0) {
                                    uVar44 = (uint)pjVar8->mps;
                                  }
                                  else {
                                    uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                  }
                                }
                                if (uVar44 != 0) {
                                  pjVar18->curctx = pjVar18->ctxs + 0x12;
                                  pjVar8 = pjVar18->ctxs[0x12];
                                  uVar54 = pjVar8->qeval;
                                  uVar26 = pjVar18->areg - uVar54;
                                  pjVar18->areg = uVar26;
                                  if (pjVar18->creg >> 0x10 < uVar54) {
                                    uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                  }
                                  else {
                                    pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                    if ((short)uVar26 < 0) {
                                      uVar44 = (uint)pjVar8->mps;
                                    }
                                    else {
                                      uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                    }
                                  }
                                  pjVar8 = *pjVar18->curctx;
                                  uVar54 = pjVar8->qeval;
                                  uVar26 = pjVar18->areg - uVar54;
                                  pjVar18->areg = uVar26;
                                  if (pjVar18->creg >> 0x10 < uVar54) {
                                    uVar12 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                  }
                                  else {
                                    pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                    if ((short)uVar26 < 0) {
                                      uVar12 = (uint)pjVar8->mps;
                                    }
                                    else {
                                      uVar12 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                    }
                                  }
                                  uVar12 = uVar44 * 2 | uVar12;
                                  lVar22 = (long)(int)(uVar12 * uVar35);
                                  uVar54 = *(ulong *)((long)pjVar30 + lVar47 + lVar22 * 8);
                                  iVar49 = iVar14 - uVar12;
                                  if (3 < uVar12) {
                                    puVar52 = (ulong *)(pjVar48 + lVar22);
                                    pjVar34 = pjVar39 + (int)(uVar12 * iVar24);
                                    goto LAB_00127417;
                                  }
                                  puVar52 = (ulong *)(lVar47 + lVar22 * 8 + (long)pjVar30);
                                  pjVar34 = (jas_seqent_t *)
                                            (lVar47 + (long)(int)(uVar12 * iVar24) * 8 +
                                            (long)local_138);
                                  switch(uVar12) {
                                  case 0:
                                    goto switchD_00127cfd_caseD_0;
                                  case 1:
                                    goto switchD_00127cfd_caseD_1;
                                  case 2:
switchD_00127cfd_caseD_2:
                                    uVar33 = uVar54 >> 4 & 0xff;
                                    bVar23 = jpc_scctxnolut[uVar33];
                                    pjVar18->curctx = pjVar18->ctxs + bVar23;
                                    pjVar8 = pjVar18->ctxs[bVar23];
                                    uVar54 = pjVar8->qeval;
                                    uVar26 = pjVar18->areg - uVar54;
                                    pjVar18->areg = uVar26;
                                    if (pjVar18->creg >> 0x10 < uVar54) {
                                      uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                    }
                                    else {
                                      pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                      if ((short)uVar26 < 0) {
                                        uVar44 = (uint)pjVar8->mps;
                                      }
                                      else {
                                        uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                      }
                                    }
                                    _Var5 = jpc_spblut[uVar33];
                                    uVar12 = uVar50;
                                    if (uVar44 != _Var5) {
                                      uVar12 = uVar46;
                                    }
                                    *pjVar34 = (long)(int)uVar12;
                                    JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar35,uVar44 != _Var5,
                                                     false);
                                    uVar54 = *puVar52 | 0x1000;
                                    *puVar52 = uVar54;
                                    goto LAB_001279e3;
                                  }
switchD_00127cfd_caseD_3:
                                  uVar33 = uVar54 >> 4 & 0xff;
                                  bVar23 = jpc_scctxnolut[uVar33];
                                  pjVar18->curctx = pjVar18->ctxs + bVar23;
                                  pjVar8 = pjVar18->ctxs[bVar23];
                                  uVar54 = pjVar8->qeval;
                                  uVar26 = pjVar18->areg - uVar54;
                                  pjVar18->areg = uVar26;
                                  if (pjVar18->creg >> 0x10 < uVar54) {
                                    uVar44 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                  }
                                  else {
                                    pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                    if ((short)uVar26 < 0) {
                                      uVar44 = (uint)pjVar8->mps;
                                    }
                                    else {
                                      uVar44 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                    }
                                  }
                                  _Var5 = jpc_spblut[uVar33];
                                  uVar12 = uVar50;
                                  if (uVar44 != _Var5) {
                                    uVar12 = uVar46;
                                  }
                                  *pjVar34 = (long)(int)uVar12;
                                  JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar35,uVar44 != _Var5,false
                                                  );
                                  uVar54 = *puVar52 | 0x1000;
                                  *puVar52 = uVar54;
LAB_00127bc0:
                                  *puVar52 = uVar54 & 0xffffffffffffbfff;
                                }
                              }
                              pjVar48 = pjVar48 + 1;
                              pjVar39 = pjVar39 + 1;
                              lVar47 = lVar47 + 8;
                            }
                            pjVar30 = pjVar30 + iVar41;
                            local_138 = local_138 + iVar24 * 4;
                            local_60 = local_60 + iVar41;
                            local_58 = local_58 + iVar41;
                            local_e0 = local_e0 + iVar41;
                          }
                          bVar55 = true;
                          if ((bVar4 & 0x20) != 0) {
                            pjVar18->curctx = pjVar18->ctxs + 0x12;
                            pjVar8 = pjVar18->ctxs[0x12];
                            uVar54 = pjVar8->qeval;
                            uVar26 = pjVar18->areg - uVar54;
                            pjVar18->areg = uVar26;
                            if (pjVar18->creg >> 0x10 < uVar54) {
                              uVar35 = jpc_mqdec_lpsexchrenormd(pjVar18);
                            }
                            else {
                              pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                              if ((short)uVar26 < 0) {
                                uVar35 = (uint)pjVar8->mps;
                              }
                              else {
                                uVar35 = jpc_mqdec_mpsexchrenormd(pjVar18);
                              }
                            }
                            pjVar8 = *pjVar18->curctx;
                            uVar54 = pjVar8->qeval;
                            uVar26 = pjVar18->areg - uVar54;
                            pjVar18->areg = uVar26;
                            if (pjVar18->creg >> 0x10 < uVar54) {
                              uVar50 = jpc_mqdec_lpsexchrenormd(pjVar18);
                            }
                            else {
                              pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                              if ((short)uVar26 < 0) {
                                uVar50 = (uint)pjVar8->mps;
                              }
                              else {
                                uVar50 = jpc_mqdec_mpsexchrenormd(pjVar18);
                              }
                            }
                            pjVar8 = *pjVar18->curctx;
                            uVar54 = pjVar8->qeval;
                            uVar26 = pjVar18->areg - uVar54;
                            pjVar18->areg = uVar26;
                            if (pjVar18->creg >> 0x10 < uVar54) {
                              uVar46 = jpc_mqdec_lpsexchrenormd(pjVar18);
                            }
                            else {
                              pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                              if ((short)uVar26 < 0) {
                                uVar46 = (uint)pjVar8->mps;
                              }
                              else {
                                uVar46 = jpc_mqdec_mpsexchrenormd(pjVar18);
                              }
                            }
                            pjVar8 = *pjVar18->curctx;
                            uVar54 = pjVar8->qeval;
                            uVar26 = pjVar18->areg - uVar54;
                            pjVar18->areg = uVar26;
                            if (pjVar18->creg >> 0x10 < uVar54) {
                              uVar43 = jpc_mqdec_lpsexchrenormd(pjVar18);
                            }
                            else {
                              pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                              if ((short)uVar26 < 0) {
                                uVar43 = (uint)pjVar8->mps;
                              }
                              else {
                                uVar43 = jpc_mqdec_mpsexchrenormd(pjVar18);
                              }
                            }
                            bVar55 = true;
                            if ((uVar43 & 1 |
                                ((uVar50 & 1) + (uVar35 & 1) * 2) * 4 + (uVar46 & 1) * 2) != 10) {
                              jas_eprintf("warning: bad segmentation symbol\n");
                            }
                          }
                        }
                        else {
                          if (uVar27 == 1) {
                            iVar36 = seg->type;
                            pjVar16 = pjVar51->flags;
                            pjVar7 = pjVar51->data;
                            uVar50 = (uint)pjVar7->numrows_;
                            iVar28 = (int)pjVar7->numcols_;
                            sVar20 = jas_matrix_rowstep(pjVar16);
                            sVar21 = jas_matrix_rowstep(pjVar7);
                            iVar24 = (int)sVar20 * 4;
                            uVar46 = (uint)(1 << (bVar23 & 0x1f)) >> 1;
                            iVar41 = (int)sVar21 * 4;
                            uVar35 = -(uint)(uVar35 == 0) | -uVar46;
                            local_150 = pjVar16->rows_[1];
                            pjVar30 = local_150 + 1;
                            pjVar48 = *pjVar7->rows_;
                            lVar42 = (long)(int)sVar20;
                            lVar47 = (long)(int)sVar21;
                            if (iVar36 == 1) {
                              pjVar18 = pjVar51->mqdec;
                              local_160 = pjVar48 + lVar47;
                              pjVar39 = pjVar48 + lVar47 * 2;
                              local_130 = pjVar48 + lVar47 * 3;
                              pjVar34 = local_150 + lVar42 + 1;
                              local_128 = local_150 + lVar42 * 2 + 1;
                              local_150 = local_150 + lVar42 * 3 + 1;
                              for (; 0 < (int)uVar50; uVar50 = uVar50 - 4) {
                                lVar42 = 0;
                                for (iVar36 = iVar28; 0 < iVar36; iVar36 = iVar36 + -1) {
                                  uVar43 = (uint)*(ulong *)((long)pjVar30 + lVar42);
                                  if ((uVar43 & 0x5000) == 0x1000) {
                                    bVar23 = jpc_magctxnolut
                                             [(ulong)(uVar43 >> 2 & 0x800) |
                                              *(ulong *)((long)pjVar30 + lVar42) & 0xff];
                                    pjVar18->curctx = pjVar18->ctxs + bVar23;
                                    pjVar8 = pjVar18->ctxs[bVar23];
                                    uVar54 = pjVar8->qeval;
                                    uVar26 = pjVar18->areg - uVar54;
                                    pjVar18->areg = uVar26;
                                    if (pjVar18->creg >> 0x10 < uVar54) {
                                      uVar43 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                    }
                                    else {
                                      pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                      if ((short)uVar26 < 0) {
                                        uVar43 = (uint)pjVar8->mps;
                                      }
                                      else {
                                        uVar43 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                      }
                                    }
                                    uVar44 = uVar35;
                                    if (uVar43 != 0) {
                                      uVar44 = uVar46;
                                    }
                                    uVar43 = -uVar44;
                                    if (-1 < *(long *)((long)pjVar48 + lVar42)) {
                                      uVar43 = uVar44;
                                    }
                                    *(long *)((long)pjVar48 + lVar42) =
                                         (long)(int)uVar43 + *(long *)((long)pjVar48 + lVar42);
                                    pbVar3 = (byte *)((long)pjVar30 + lVar42 + 1);
                                    *pbVar3 = *pbVar3 | 0x20;
                                  }
                                  if (uVar50 != 1) {
                                    uVar43 = (uint)*(ulong *)((long)pjVar34 + lVar42);
                                    if ((uVar43 & 0x5000) == 0x1000) {
                                      bVar23 = jpc_magctxnolut
                                               [(ulong)(uVar43 >> 2 & 0x800) |
                                                *(ulong *)((long)pjVar34 + lVar42) & 0xff];
                                      pjVar18->curctx = pjVar18->ctxs + bVar23;
                                      pjVar8 = pjVar18->ctxs[bVar23];
                                      uVar54 = pjVar8->qeval;
                                      uVar26 = pjVar18->areg - uVar54;
                                      pjVar18->areg = uVar26;
                                      if (pjVar18->creg >> 0x10 < uVar54) {
                                        uVar43 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                      }
                                      else {
                                        pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                        if ((short)uVar26 < 0) {
                                          uVar43 = (uint)pjVar8->mps;
                                        }
                                        else {
                                          uVar43 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                        }
                                      }
                                      uVar44 = uVar35;
                                      if (uVar43 != 0) {
                                        uVar44 = uVar46;
                                      }
                                      uVar43 = -uVar44;
                                      if (-1 < *(long *)((long)local_160 + lVar42)) {
                                        uVar43 = uVar44;
                                      }
                                      *(long *)((long)local_160 + lVar42) =
                                           (long)(int)uVar43 + *(long *)((long)local_160 + lVar42);
                                      pbVar3 = (byte *)((long)pjVar34 + lVar42 + 1);
                                      *pbVar3 = *pbVar3 | 0x20;
                                    }
                                    if (2 < uVar50) {
                                      uVar43 = (uint)*(ulong *)((long)local_128 + lVar42);
                                      if ((uVar43 & 0x5000) == 0x1000) {
                                        bVar23 = jpc_magctxnolut
                                                 [(ulong)(uVar43 >> 2 & 0x800) |
                                                  *(ulong *)((long)local_128 + lVar42) & 0xff];
                                        pjVar18->curctx = pjVar18->ctxs + bVar23;
                                        pjVar8 = pjVar18->ctxs[bVar23];
                                        uVar54 = pjVar8->qeval;
                                        uVar26 = pjVar18->areg - uVar54;
                                        pjVar18->areg = uVar26;
                                        if (pjVar18->creg >> 0x10 < uVar54) {
                                          uVar43 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                        }
                                        else {
                                          pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                          if ((short)uVar26 < 0) {
                                            uVar43 = (uint)pjVar8->mps;
                                          }
                                          else {
                                            uVar43 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                          }
                                        }
                                        uVar44 = uVar35;
                                        if (uVar43 != 0) {
                                          uVar44 = uVar46;
                                        }
                                        uVar43 = -uVar44;
                                        if (-1 < *(long *)((long)pjVar39 + lVar42)) {
                                          uVar43 = uVar44;
                                        }
                                        *(long *)((long)pjVar39 + lVar42) =
                                             (long)(int)uVar43 + *(long *)((long)pjVar39 + lVar42);
                                        pbVar3 = (byte *)((long)local_128 + lVar42 + 1);
                                        *pbVar3 = *pbVar3 | 0x20;
                                      }
                                      if (uVar50 != 3) {
                                        uVar43 = (uint)*(ulong *)((long)local_150 + lVar42);
                                        if ((uVar43 & 0x5000) == 0x1000) {
                                          bVar23 = jpc_magctxnolut
                                                   [(ulong)(uVar43 >> 2 & 0x800) |
                                                    *(ulong *)((long)local_150 + lVar42) & 0xff];
                                          pjVar18->curctx = pjVar18->ctxs + bVar23;
                                          pjVar8 = pjVar18->ctxs[bVar23];
                                          uVar54 = pjVar8->qeval;
                                          uVar26 = pjVar18->areg - uVar54;
                                          pjVar18->areg = uVar26;
                                          if (pjVar18->creg >> 0x10 < uVar54) {
                                            uVar43 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                          }
                                          else {
                                            pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                            if ((short)uVar26 < 0) {
                                              uVar43 = (uint)pjVar8->mps;
                                            }
                                            else {
                                              uVar43 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                            }
                                          }
                                          uVar44 = uVar35;
                                          if (uVar43 != 0) {
                                            uVar44 = uVar46;
                                          }
                                          uVar43 = -uVar44;
                                          if (-1 < *(long *)((long)local_130 + lVar42)) {
                                            uVar43 = uVar44;
                                          }
                                          *(long *)((long)local_130 + lVar42) =
                                               (long)(int)uVar43 +
                                               *(long *)((long)local_130 + lVar42);
                                          pbVar3 = (byte *)((long)local_150 + lVar42 + 1);
                                          *pbVar3 = *pbVar3 | 0x20;
                                        }
                                      }
                                    }
                                  }
                                  lVar42 = lVar42 + 8;
                                }
                                pjVar48 = pjVar48 + iVar41;
                                local_160 = local_160 + iVar41;
                                pjVar39 = pjVar39 + iVar41;
                                local_130 = local_130 + iVar41;
                                pjVar30 = pjVar30 + iVar24;
                                pjVar34 = pjVar34 + iVar24;
                                local_128 = local_128 + iVar24;
                                local_150 = local_150 + iVar24;
                              }
                            }
                            else {
                              local_160 = pjVar48 + lVar47;
                              pjVar19 = pjVar51->nulldec;
                              pjVar34 = pjVar48 + lVar47 * 2;
                              local_130 = pjVar48 + lVar47 * 3;
                              pjVar39 = local_150 + lVar42 + 1;
                              local_128 = local_150 + lVar42 * 2 + 1;
                              local_150 = local_150 + lVar42 * 3 + 1;
                              for (; 0 < (int)uVar50; uVar50 = uVar50 - 4) {
                                lVar42 = 0;
                                for (iVar36 = iVar28; 0 < iVar36; iVar36 = iVar36 + -1) {
                                  if ((*(uint *)((long)pjVar30 + lVar42) & 0x5000) == 0x1000) {
                                    if ((pjVar19->openmode_ & 1) == 0) {
                                      __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2cd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                    }
                                    iVar45 = pjVar19->cnt_;
                                    uVar43 = iVar45 - 1;
                                    pjVar19->cnt_ = uVar43;
                                    if (iVar45 < 1) {
                                      uVar43 = jpc_bitstream_fillbuf(pjVar19);
                                      if ((int)uVar43 < 0) goto LAB_00128585;
                                    }
                                    else {
                                      uVar43 = (uint)((pjVar19->buf_ >> ((ulong)uVar43 & 0x3f) & 1)
                                                     != 0);
                                    }
                                    uVar44 = uVar35;
                                    if (uVar43 != 0) {
                                      uVar44 = uVar46;
                                    }
                                    lVar47 = -(long)(int)uVar44;
                                    if (-1 < *(long *)((long)pjVar48 + lVar42)) {
                                      lVar47 = (long)(int)uVar44;
                                    }
                                    *(long *)((long)pjVar48 + lVar42) =
                                         lVar47 + *(long *)((long)pjVar48 + lVar42);
                                    pbVar3 = (byte *)((long)pjVar30 + lVar42 + 1);
                                    *pbVar3 = *pbVar3 | 0x20;
                                  }
                                  if (uVar50 != 1) {
                                    if ((*(uint *)((long)pjVar39 + lVar42) & 0x5000) == 0x1000) {
                                      if ((pjVar19->openmode_ & 1) == 0) {
                                        __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2d5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                      }
                                      iVar45 = pjVar19->cnt_;
                                      uVar43 = iVar45 - 1;
                                      pjVar19->cnt_ = uVar43;
                                      if (iVar45 < 1) {
                                        uVar43 = jpc_bitstream_fillbuf(pjVar19);
                                        if ((int)uVar43 < 0) goto LAB_00128585;
                                      }
                                      else {
                                        uVar43 = (uint)((pjVar19->buf_ >> ((ulong)uVar43 & 0x3f) & 1
                                                        ) != 0);
                                      }
                                      uVar44 = uVar35;
                                      if (uVar43 != 0) {
                                        uVar44 = uVar46;
                                      }
                                      lVar47 = -(long)(int)uVar44;
                                      if (-1 < *(long *)((long)local_160 + lVar42)) {
                                        lVar47 = (long)(int)uVar44;
                                      }
                                      *(long *)((long)local_160 + lVar42) =
                                           lVar47 + *(long *)((long)local_160 + lVar42);
                                      pbVar3 = (byte *)((long)pjVar39 + lVar42 + 1);
                                      *pbVar3 = *pbVar3 | 0x20;
                                    }
                                    if (2 < uVar50) {
                                      if ((*(uint *)((long)local_128 + lVar42) & 0x5000) == 0x1000)
                                      {
                                        if ((pjVar19->openmode_ & 1) == 0) {
                                          __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2dd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                        }
                                        iVar45 = pjVar19->cnt_;
                                        uVar43 = iVar45 - 1;
                                        pjVar19->cnt_ = uVar43;
                                        if (iVar45 < 1) {
                                          uVar43 = jpc_bitstream_fillbuf(pjVar19);
                                          if ((int)uVar43 < 0) goto LAB_00128585;
                                        }
                                        else {
                                          uVar43 = (uint)((pjVar19->buf_ >> ((ulong)uVar43 & 0x3f) &
                                                          1) != 0);
                                        }
                                        uVar44 = uVar35;
                                        if (uVar43 != 0) {
                                          uVar44 = uVar46;
                                        }
                                        lVar47 = -(long)(int)uVar44;
                                        if (-1 < *(long *)((long)pjVar34 + lVar42)) {
                                          lVar47 = (long)(int)uVar44;
                                        }
                                        *(long *)((long)pjVar34 + lVar42) =
                                             lVar47 + *(long *)((long)pjVar34 + lVar42);
                                        pbVar3 = (byte *)((long)local_128 + lVar42 + 1);
                                        *pbVar3 = *pbVar3 | 0x20;
                                      }
                                      if ((uVar50 != 3) &&
                                         ((*(uint *)((long)local_150 + lVar42) & 0x5000) == 0x1000))
                                      {
                                        if ((pjVar19->openmode_ & 1) == 0) {
                                          __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2e5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                        }
                                        iVar45 = pjVar19->cnt_;
                                        uVar43 = iVar45 - 1;
                                        pjVar19->cnt_ = uVar43;
                                        if (iVar45 < 1) {
                                          uVar43 = jpc_bitstream_fillbuf(pjVar19);
                                          if ((int)uVar43 < 0) goto LAB_00128585;
                                        }
                                        else {
                                          uVar43 = (uint)((pjVar19->buf_ >> ((ulong)uVar43 & 0x3f) &
                                                          1) != 0);
                                        }
                                        uVar44 = uVar35;
                                        if (uVar43 != 0) {
                                          uVar44 = uVar46;
                                        }
                                        lVar47 = -(long)(int)uVar44;
                                        if (-1 < *(long *)((long)local_130 + lVar42)) {
                                          lVar47 = (long)(int)uVar44;
                                        }
                                        *(long *)((long)local_130 + lVar42) =
                                             lVar47 + *(long *)((long)local_130 + lVar42);
                                        pbVar3 = (byte *)((long)local_150 + lVar42 + 1);
                                        *pbVar3 = *pbVar3 | 0x20;
                                      }
                                    }
                                  }
                                  lVar42 = lVar42 + 8;
                                }
                                pjVar48 = pjVar48 + iVar41;
                                local_160 = local_160 + iVar41;
                                pjVar34 = pjVar34 + iVar41;
                                local_130 = local_130 + iVar41;
                                pjVar30 = pjVar30 + iVar24;
                                pjVar39 = pjVar39 + iVar24;
                                local_128 = local_128 + iVar24;
                                local_150 = local_150 + iVar24;
                              }
                            }
                          }
                          else {
                            if (uVar27 != 0) {
                              bVar55 = false;
                              goto LAB_001286cc;
                            }
                            if (seg->type == 1) {
                              pjVar18 = pjVar51->mqdec;
                              pjVar16 = pjVar51->flags;
                              iVar36 = pjVar53->orient;
                              bVar4 = tile->cp->ccps[iVar31].cblkctx;
                              pjVar7 = pjVar51->data;
                              jVar10 = pjVar7->numrows_;
                              jVar11 = pjVar7->numcols_;
                              sVar20 = jas_matrix_rowstep(pjVar16);
                              sVar21 = jas_matrix_rowstep(pjVar7);
                              uVar46 = (uint)sVar20;
                              iVar28 = uVar46 * 4;
                              iVar24 = (int)sVar21 * 4;
                              uVar43 = (uint)(1 << (bVar23 & 0x1f)) >> 1 | 1 << (uVar35 & 0x1f);
                              local_110 = pjVar16->rows_[1];
                              _neghalf = local_110 + 1;
                              local_130 = *pjVar7->rows_;
                              uVar50 = iVar36 << 8;
                              uVar44 = -uVar43;
                              lVar42 = (long)(int)uVar46;
                              lVar47 = (long)(int)sVar21;
                              _poshalf = local_110 + lVar42 + 1;
                              local_120 = local_110 + lVar42 * 2 + 1;
                              local_110 = local_110 + lVar42 * 3 + 1;
                              local_118 = local_130 + lVar47;
                              local_108 = local_130 + lVar47 * 2;
                              local_e0 = local_130 + lVar47 * 3;
                              for (uVar35 = (uint)jVar10; 0 < (int)uVar35; uVar35 = uVar35 - 4) {
                                lVar42 = 0;
                                for (iVar36 = (int)jVar11; 0 < iVar36; iVar36 = iVar36 + -1) {
                                  puVar52 = (ulong *)((long)_neghalf + lVar42);
                                  uVar54 = *puVar52;
                                  if ((uVar54 & 0x5000) == 0 && (uVar54 & 0xff) != 0) {
                                    bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar50];
                                    pjVar18->curctx = pjVar18->ctxs + bVar23;
                                    pjVar8 = pjVar18->ctxs[bVar23];
                                    uVar33 = pjVar8->qeval;
                                    uVar26 = pjVar18->areg - uVar33;
                                    pjVar18->areg = uVar26;
                                    if (pjVar18->creg >> 0x10 < uVar33) {
                                      uVar12 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                    }
                                    else {
                                      pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                      if ((short)uVar26 < 0) {
                                        uVar12 = (uint)pjVar8->mps;
                                      }
                                      else {
                                        uVar12 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                      }
                                    }
                                    if (uVar12 != 0) {
                                      uVar12 = (uint)uVar54 >> 4 & 0xff;
                                      bVar23 = jpc_scctxnolut[uVar12];
                                      pjVar18->curctx = pjVar18->ctxs + bVar23;
                                      pjVar8 = pjVar18->ctxs[bVar23];
                                      uVar54 = pjVar8->qeval;
                                      uVar26 = pjVar18->areg - uVar54;
                                      pjVar18->areg = uVar26;
                                      if (pjVar18->creg >> 0x10 < uVar54) {
                                        uVar13 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                      }
                                      else {
                                        pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                        if ((short)uVar26 < 0) {
                                          uVar13 = (uint)pjVar8->mps;
                                        }
                                        else {
                                          uVar13 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                        }
                                      }
                                      uVar9 = uVar43;
                                      if (uVar13 != jpc_spblut[uVar12]) {
                                        uVar9 = uVar44;
                                      }
                                      JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar46,
                                                       uVar13 != jpc_spblut[uVar12],
                                                       (_Bool)((bVar4 & 8) >> 3));
                                      *(byte *)((long)puVar52 + 1) =
                                           *(byte *)((long)puVar52 + 1) | 0x10;
                                      *(long *)((long)local_130 + lVar42) = (long)(int)uVar9;
                                    }
                                    *(byte *)((long)puVar52 + 1) =
                                         *(byte *)((long)puVar52 + 1) | 0x40;
                                  }
                                  if (uVar35 != 1) {
                                    uVar54 = *(ulong *)((long)_poshalf + lVar42);
                                    if ((uVar54 & 0x5000) == 0 && (uVar54 & 0xff) != 0) {
                                      bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar50];
                                      pjVar18->curctx = pjVar18->ctxs + bVar23;
                                      pjVar8 = pjVar18->ctxs[bVar23];
                                      uVar33 = pjVar8->qeval;
                                      uVar26 = pjVar18->areg - uVar33;
                                      pjVar18->areg = uVar26;
                                      if (pjVar18->creg >> 0x10 < uVar33) {
                                        uVar12 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                      }
                                      else {
                                        pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                        if ((short)uVar26 < 0) {
                                          uVar12 = (uint)pjVar8->mps;
                                        }
                                        else {
                                          uVar12 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                        }
                                      }
                                      pjVar1 = (jpc_fix_t *)((long)_poshalf + lVar42);
                                      if (uVar12 != 0) {
                                        uVar12 = (uint)uVar54 >> 4 & 0xff;
                                        bVar23 = jpc_scctxnolut[uVar12];
                                        pjVar18->curctx = pjVar18->ctxs + bVar23;
                                        pjVar8 = pjVar18->ctxs[bVar23];
                                        uVar54 = pjVar8->qeval;
                                        uVar26 = pjVar18->areg - uVar54;
                                        pjVar18->areg = uVar26;
                                        if (pjVar18->creg >> 0x10 < uVar54) {
                                          uVar13 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                        }
                                        else {
                                          pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                          if ((short)uVar26 < 0) {
                                            uVar13 = (uint)pjVar8->mps;
                                          }
                                          else {
                                            uVar13 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                          }
                                        }
                                        uVar9 = uVar43;
                                        if (uVar13 != jpc_spblut[uVar12]) {
                                          uVar9 = uVar44;
                                        }
                                        JPC_UPDATEFLAGS4(pjVar1,uVar46,uVar13 != jpc_spblut[uVar12],
                                                         false);
                                        *(byte *)((long)pjVar1 + 1) =
                                             *(byte *)((long)pjVar1 + 1) | 0x10;
                                        *(long *)((long)local_118 + lVar42) = (long)(int)uVar9;
                                      }
                                      *(byte *)((long)pjVar1 + 1) =
                                           *(byte *)((long)pjVar1 + 1) | 0x40;
                                    }
                                    if (2 < uVar35) {
                                      uVar54 = *(ulong *)((long)local_120 + lVar42);
                                      if ((uVar54 & 0x5000) == 0 && (uVar54 & 0xff) != 0) {
                                        bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar50];
                                        pjVar18->curctx = pjVar18->ctxs + bVar23;
                                        pjVar8 = pjVar18->ctxs[bVar23];
                                        uVar33 = pjVar8->qeval;
                                        uVar26 = pjVar18->areg - uVar33;
                                        pjVar18->areg = uVar26;
                                        if (pjVar18->creg >> 0x10 < uVar33) {
                                          uVar12 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                        }
                                        else {
                                          pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                          if ((short)uVar26 < 0) {
                                            uVar12 = (uint)pjVar8->mps;
                                          }
                                          else {
                                            uVar12 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                          }
                                        }
                                        pjVar1 = (jpc_fix_t *)((long)local_120 + lVar42);
                                        if (uVar12 != 0) {
                                          uVar12 = (uint)uVar54 >> 4 & 0xff;
                                          bVar23 = jpc_scctxnolut[uVar12];
                                          pjVar18->curctx = pjVar18->ctxs + bVar23;
                                          pjVar8 = pjVar18->ctxs[bVar23];
                                          uVar54 = pjVar8->qeval;
                                          uVar26 = pjVar18->areg - uVar54;
                                          pjVar18->areg = uVar26;
                                          if (pjVar18->creg >> 0x10 < uVar54) {
                                            uVar13 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                          }
                                          else {
                                            pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                            if ((short)uVar26 < 0) {
                                              uVar13 = (uint)pjVar8->mps;
                                            }
                                            else {
                                              uVar13 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                            }
                                          }
                                          uVar9 = uVar43;
                                          if (uVar13 != jpc_spblut[uVar12]) {
                                            uVar9 = uVar44;
                                          }
                                          JPC_UPDATEFLAGS4(pjVar1,uVar46,
                                                           uVar13 != jpc_spblut[uVar12],false);
                                          *(byte *)((long)pjVar1 + 1) =
                                               *(byte *)((long)pjVar1 + 1) | 0x10;
                                          *(long *)((long)local_108 + lVar42) = (long)(int)uVar9;
                                        }
                                        *(byte *)((long)pjVar1 + 1) =
                                             *(byte *)((long)pjVar1 + 1) | 0x40;
                                      }
                                      if (uVar35 != 3) {
                                        uVar54 = *(ulong *)((long)local_110 + lVar42);
                                        if ((uVar54 & 0x5000) == 0 && (uVar54 & 0xff) != 0) {
                                          bVar23 = jpc_zcctxnolut[(uint)uVar54 & 0xff | uVar50];
                                          pjVar18->curctx = pjVar18->ctxs + bVar23;
                                          pjVar8 = pjVar18->ctxs[bVar23];
                                          uVar33 = pjVar8->qeval;
                                          uVar26 = pjVar18->areg - uVar33;
                                          pjVar18->areg = uVar26;
                                          if (pjVar18->creg >> 0x10 < uVar33) {
                                            uVar12 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                          }
                                          else {
                                            pjVar18->creg = pjVar18->creg + uVar33 * -0x10000;
                                            if ((short)uVar26 < 0) {
                                              uVar12 = (uint)pjVar8->mps;
                                            }
                                            else {
                                              uVar12 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                            }
                                          }
                                          pjVar1 = (jpc_fix_t *)((long)local_110 + lVar42);
                                          if (uVar12 != 0) {
                                            uVar12 = (uint)uVar54 >> 4 & 0xff;
                                            bVar23 = jpc_scctxnolut[uVar12];
                                            pjVar18->curctx = pjVar18->ctxs + bVar23;
                                            pjVar8 = pjVar18->ctxs[bVar23];
                                            uVar54 = pjVar8->qeval;
                                            uVar26 = pjVar18->areg - uVar54;
                                            pjVar18->areg = uVar26;
                                            if (pjVar18->creg >> 0x10 < uVar54) {
                                              uVar13 = jpc_mqdec_lpsexchrenormd(pjVar18);
                                            }
                                            else {
                                              pjVar18->creg = pjVar18->creg + uVar54 * -0x10000;
                                              if ((short)uVar26 < 0) {
                                                uVar13 = (uint)pjVar8->mps;
                                              }
                                              else {
                                                uVar13 = jpc_mqdec_mpsexchrenormd(pjVar18);
                                              }
                                            }
                                            uVar9 = uVar43;
                                            if (uVar13 != jpc_spblut[uVar12]) {
                                              uVar9 = uVar44;
                                            }
                                            JPC_UPDATEFLAGS4(pjVar1,uVar46,
                                                             uVar13 != jpc_spblut[uVar12],false);
                                            *(byte *)((long)pjVar1 + 1) =
                                                 *(byte *)((long)pjVar1 + 1) | 0x10;
                                            *(long *)((long)local_e0 + lVar42) = (long)(int)uVar9;
                                          }
                                          *(byte *)((long)pjVar1 + 1) =
                                               *(byte *)((long)pjVar1 + 1) | 0x40;
                                        }
                                      }
                                    }
                                  }
                                  lVar42 = lVar42 + 8;
                                }
                                _neghalf = _neghalf + iVar28;
                                _poshalf = _poshalf + iVar28;
                                local_120 = local_120 + iVar28;
                                local_110 = local_110 + iVar28;
                                local_130 = local_130 + iVar24;
                                local_118 = local_118 + iVar24;
                                local_108 = local_108 + iVar24;
                                local_e0 = local_e0 + iVar24;
                              }
                            }
                            else {
                              pjVar19 = pjVar51->nulldec;
                              pjVar16 = pjVar51->flags;
                              bVar4 = tile->cp->ccps[iVar31].cblkctx;
                              pjVar7 = pjVar51->data;
                              jVar10 = pjVar7->numrows_;
                              jVar11 = pjVar7->numcols_;
                              sVar20 = jas_matrix_rowstep(pjVar16);
                              sVar21 = jas_matrix_rowstep(pjVar7);
                              uVar50 = (uint)sVar20;
                              iVar28 = uVar50 * 4;
                              iVar36 = (int)sVar21 * 4;
                              uVar46 = (uint)(1 << (bVar23 & 0x1f)) >> 1 | 1 << (uVar35 & 0x1f);
                              _width = pjVar16->rows_[1];
                              _neghalf = _width + 1;
                              local_120 = *pjVar7->rows_;
                              uVar43 = -uVar46;
                              lVar42 = (long)(int)uVar50;
                              lVar47 = (long)(int)sVar21;
                              local_138 = _width + lVar42 + 1;
                              local_150 = _width + lVar42 * 2 + 1;
                              _width = _width + lVar42 * 3 + 1;
                              local_110 = local_120 + lVar47;
                              local_118 = local_120 + lVar47 * 2;
                              local_108 = local_120 + lVar47 * 3;
                              for (uVar35 = (uint)jVar10; 0 < (int)uVar35; uVar35 = uVar35 - 4) {
                                lVar42 = 0;
                                for (iVar24 = (int)jVar11; 0 < iVar24; iVar24 = iVar24 + -1) {
                                  puVar52 = (ulong *)((long)_neghalf + lVar42);
                                  if ((*puVar52 & 0x5000) == 0 && (char)*puVar52 != '\0') {
                                    if ((pjVar19->openmode_ & 1) == 0) {
LAB_001288a8:
                                      __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x204,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                    }
                                    iVar41 = pjVar19->cnt_;
                                    uVar44 = iVar41 - 1;
                                    pjVar19->cnt_ = uVar44;
                                    if (iVar41 < 1) {
                                      uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                      if ((int)uVar44 < 0) goto LAB_00128585;
                                    }
                                    else {
                                      uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) & 1)
                                                     != 0);
                                    }
                                    if (uVar44 != 0) {
                                      if ((pjVar19->openmode_ & 1) == 0) goto LAB_001288a8;
                                      iVar41 = pjVar19->cnt_;
                                      uVar44 = iVar41 - 1;
                                      pjVar19->cnt_ = uVar44;
                                      if (iVar41 < 1) {
                                        uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                        if ((int)uVar44 < 0) goto LAB_00128585;
                                      }
                                      else {
                                        uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) & 1
                                                        ) != 0);
                                      }
                                      uVar12 = uVar46;
                                      if (uVar44 != 0) {
                                        uVar12 = uVar43;
                                      }
                                      JPC_UPDATEFLAGS4((jpc_fix_t *)puVar52,uVar50,uVar44 != 0,
                                                       (_Bool)((bVar4 & 8) >> 3));
                                      *(byte *)((long)puVar52 + 1) =
                                           *(byte *)((long)puVar52 + 1) | 0x10;
                                      *(long *)((long)local_120 + lVar42) = (long)(int)uVar12;
                                    }
                                    *(byte *)((long)puVar52 + 1) =
                                         *(byte *)((long)puVar52 + 1) | 0x40;
                                  }
                                  if (uVar35 != 1) {
                                    if ((*(ulong *)((long)local_138 + lVar42) & 0x5000) == 0 &&
                                        (char)*(ulong *)((long)local_138 + lVar42) != '\0') {
                                      if ((pjVar19->openmode_ & 1) == 0) {
LAB_001288e6:
                                        __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x20d,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                      }
                                      iVar41 = pjVar19->cnt_;
                                      uVar44 = iVar41 - 1;
                                      pjVar19->cnt_ = uVar44;
                                      if (iVar41 < 1) {
                                        uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                        if ((int)uVar44 < 0) goto LAB_00128585;
                                      }
                                      else {
                                        uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) & 1
                                                        ) != 0);
                                      }
                                      pjVar1 = (jpc_fix_t *)((long)local_138 + lVar42);
                                      if (uVar44 != 0) {
                                        if ((pjVar19->openmode_ & 1) == 0) goto LAB_001288e6;
                                        iVar41 = pjVar19->cnt_;
                                        uVar44 = iVar41 - 1;
                                        pjVar19->cnt_ = uVar44;
                                        if (iVar41 < 1) {
                                          uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                          if ((int)uVar44 < 0) goto LAB_00128585;
                                        }
                                        else {
                                          uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) &
                                                          1) != 0);
                                        }
                                        uVar12 = uVar46;
                                        if (uVar44 != 0) {
                                          uVar12 = uVar43;
                                        }
                                        JPC_UPDATEFLAGS4(pjVar1,uVar50,uVar44 != 0,false);
                                        *(byte *)((long)pjVar1 + 1) =
                                             *(byte *)((long)pjVar1 + 1) | 0x10;
                                        *(long *)((long)local_110 + lVar42) = (long)(int)uVar12;
                                      }
                                      *(byte *)((long)pjVar1 + 1) =
                                           *(byte *)((long)pjVar1 + 1) | 0x40;
                                    }
                                    if (2 < uVar35) {
                                      if ((*(ulong *)((long)local_150 + lVar42) & 0x5000) == 0 &&
                                          (char)*(ulong *)((long)local_150 + lVar42) != '\0') {
                                        if ((pjVar19->openmode_ & 1) == 0) {
LAB_00128924:
                                          __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x216,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                        }
                                        iVar41 = pjVar19->cnt_;
                                        uVar44 = iVar41 - 1;
                                        pjVar19->cnt_ = uVar44;
                                        if (iVar41 < 1) {
                                          uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                          if ((int)uVar44 < 0) goto LAB_00128585;
                                        }
                                        else {
                                          uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) &
                                                          1) != 0);
                                        }
                                        pjVar1 = (jpc_fix_t *)((long)local_150 + lVar42);
                                        if (uVar44 != 0) {
                                          if ((pjVar19->openmode_ & 1) == 0) goto LAB_00128924;
                                          iVar41 = pjVar19->cnt_;
                                          uVar44 = iVar41 - 1;
                                          pjVar19->cnt_ = uVar44;
                                          if (iVar41 < 1) {
                                            uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                            if ((int)uVar44 < 0) goto LAB_00128585;
                                          }
                                          else {
                                            uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f)
                                                            & 1) != 0);
                                          }
                                          uVar12 = uVar46;
                                          if (uVar44 != 0) {
                                            uVar12 = uVar43;
                                          }
                                          JPC_UPDATEFLAGS4(pjVar1,uVar50,uVar44 != 0,false);
                                          *(byte *)((long)pjVar1 + 1) =
                                               *(byte *)((long)pjVar1 + 1) | 0x10;
                                          *(long *)((long)local_118 + lVar42) = (long)(int)uVar12;
                                        }
                                        *(byte *)((long)pjVar1 + 1) =
                                             *(byte *)((long)pjVar1 + 1) | 0x40;
                                      }
                                      if ((uVar35 != 3) &&
                                         ((*(ulong *)((long)_width + lVar42) & 0x5000) == 0 &&
                                          (char)*(ulong *)((long)_width + lVar42) != '\0')) {
                                        if ((pjVar19->openmode_ & 1) == 0) {
LAB_00128981:
                                          __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x21f,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                        }
                                        iVar41 = pjVar19->cnt_;
                                        uVar44 = iVar41 - 1;
                                        pjVar19->cnt_ = uVar44;
                                        if (iVar41 < 1) {
                                          uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                          if ((int)uVar44 < 0) goto LAB_00128585;
                                        }
                                        else {
                                          uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f) &
                                                          1) != 0);
                                        }
                                        pjVar1 = (jpc_fix_t *)((long)_width + lVar42);
                                        if (uVar44 != 0) {
                                          if ((pjVar19->openmode_ & 1) == 0) goto LAB_00128981;
                                          iVar41 = pjVar19->cnt_;
                                          uVar44 = iVar41 - 1;
                                          pjVar19->cnt_ = uVar44;
                                          if (iVar41 < 1) {
                                            uVar44 = jpc_bitstream_fillbuf(pjVar19);
                                            if ((int)uVar44 < 0) goto LAB_00128585;
                                          }
                                          else {
                                            uVar44 = (uint)((pjVar19->buf_ >> ((ulong)uVar44 & 0x3f)
                                                            & 1) != 0);
                                          }
                                          uVar12 = uVar46;
                                          if (uVar44 != 0) {
                                            uVar12 = uVar43;
                                          }
                                          JPC_UPDATEFLAGS4(pjVar1,uVar50,uVar44 != 0,false);
                                          *(byte *)((long)pjVar1 + 1) =
                                               *(byte *)((long)pjVar1 + 1) | 0x10;
                                          *(long *)((long)local_108 + lVar42) = (long)(int)uVar12;
                                        }
                                        *(byte *)((long)pjVar1 + 1) =
                                             *(byte *)((long)pjVar1 + 1) | 0x40;
                                      }
                                    }
                                  }
                                  lVar42 = lVar42 + 8;
                                }
                                _neghalf = _neghalf + iVar28;
                                local_138 = local_138 + iVar28;
                                local_150 = local_150 + iVar28;
                                _width = _width + iVar28;
                                local_120 = local_120 + iVar36;
                                local_110 = local_110 + iVar36;
                                local_118 = local_118 + iVar36;
                                local_108 = local_108 + iVar36;
                              }
                            }
                          }
                          bVar55 = true;
                        }
                        goto LAB_001286cc;
                      }
                      goto LAB_001287f0;
                    }
                    if (seg->type != 1) {
                      if (seg->type != 2) {
                        __assert_fail("seg->type == JPC_SEG_RAW",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                      ,0x131,
                                      "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                     );
                      }
                      bVar55 = (tile->cp->ccps[iVar31].cblkctx & 0x10) == 0;
                      iVar32 = 0x2a;
                      if (bVar55) {
                        iVar32 = 0;
                      }
                      iVar36 = 0x7f;
                      if (bVar55) {
                        iVar36 = 0;
                      }
                      iVar32 = jpc_bitstream_inalign(pjVar51->nulldec,iVar36,iVar32);
                      if (iVar32 < 0) {
                        return -1;
                      }
                      if (iVar32 != 0) {
                        jas_eprintf("warning: bad termination pattern detected\n");
                      }
                      jpc_bitstream_close(pjVar51->nulldec);
                      pjVar51->nulldec = (jpc_bitstream_t *)0x0;
                    }
                    *ppjVar2 = seg->next;
                    jpc_seglist_remove(&pjVar51->segs,seg);
                    jpc_seg_destroy(seg);
                    pjVar17 = (jpc_dec_seglist_t *)ppjVar2;
                  }
                  if (*ppjVar2 != (jpc_dec_seg_t *)0x0) {
                    __assert_fail("dopartial ? (!cblk->curseg) : 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                  ,0x149,
                                  "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                 );
                  }
LAB_001287f0:
                  pjVar51 = pjVar51 + 1;
                }
              }
              local_98 = local_98 + 1;
            }
          }
          pjVar53 = pjVar53 + 1;
        }
      }
      local_b8 = local_b8 + 1;
    }
    iVar15 = iVar15 + -1;
    local_a0 = local_a0 + 1;
  } while( true );
LAB_00128585:
  bVar55 = false;
LAB_001286cc:
  if ((tile->cp->ccps[iVar31].cblkctx & 2) != 0) {
    jpc_mqdec_setctxs(pjVar51->mqdec,0x13,jpc_mqctxs);
  }
  iVar32 = iVar32 + 1;
  if (!bVar55) {
    jas_eprintf("coding pass failed passtype=%d segtype=%d\n",(ulong)uVar27,(ulong)(uint)seg->type);
    return -1;
  }
  goto LAB_00126643;
}

Assistant:

int jpc_dec_decodecblks(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compcnt;
	jpc_dec_rlvl_t *rlvl;
	int rlvlcnt;
	jpc_dec_band_t *band;
	int bandcnt;
	jpc_dec_prc_t *prc;
	int prccnt;
	jpc_dec_cblk_t *cblk;
	int cblkcnt;

	for (compcnt = dec->numcomps, tcomp = tile->tcomps; compcnt > 0;
	  --compcnt, ++tcomp) {
		for (rlvlcnt = tcomp->numrlvls, rlvl = tcomp->rlvls;
		  rlvlcnt > 0; --rlvlcnt, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandcnt = rlvl->numbands, band = rlvl->bands;
			  bandcnt > 0; --bandcnt, ++band) {
				if (!band->data) {
					continue;
				}
				for (prccnt = rlvl->numprcs, prc = band->prcs;
				  prccnt > 0; --prccnt, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					for (cblkcnt = prc->numcblks,
					  cblk = prc->cblks; cblkcnt > 0;
					  --cblkcnt, ++cblk) {
						if (jpc_dec_decodecblk(dec, tile, tcomp,
						  band, cblk, 1, JPC_MAXLYRS)) {
							return -1;
						}
					}
				}

			}
		}
	}

	return 0;
}